

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

Type * QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
       ::instance(void)

{
  int iVar1;
  PlainType *pPVar2;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
      ::instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>
      ::Holder((Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry> *)
               0x3a57ea);
      __cxa_atexit(QtGlobalStatic::
                   Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
                   ~Holder,&instance::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>>
                           ::instance()::holder);
    }
  }
  pPVar2 = QtGlobalStatic::
           Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::pointer
                     ((Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>
                       *)&instance::holder.storage);
  return pPVar2;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }